

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O3

int __thiscall
irr::scene::CMeshSceneNode::clone
          (CMeshSceneNode *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int *piVar1;
  long lVar2;
  CMeshSceneNode *this_00;
  
  if (__fn == (__fn *)0x0) {
    __fn = *(__fn **)&this->field_0xc0;
  }
  if (__child_stack == (void *)0x0) {
    __child_stack = *(void **)&this->field_0xc8;
  }
  this_00 = (CMeshSceneNode *)operator_new(0x1f8);
  CMeshSceneNode(this_00,this->Mesh,(ISceneNode *)__fn,(ISceneManager *)__child_stack,
                 *(s32 *)&this->field_0xd0,(vector3df *)&this->field_0x70,
                 (vector3df *)&this->field_0x7c,(vector3df *)&this->field_0x88);
  ISceneNode::cloneMembers((ISceneNode *)this_00,(ISceneNode *)this,(ISceneManager *)__child_stack);
  this_00->ReadOnlyMaterials = this->ReadOnlyMaterials;
  if (this_00 != this) {
    ::std::vector<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>::operator=
              (&(this_00->Materials).m_data,&(this->Materials).m_data);
    (this_00->Materials).is_sorted = (this->Materials).is_sorted;
  }
  if ((ISceneNode *)__fn != (ISceneNode *)0x0) {
    lVar2 = *(long *)(*(long *)this_00 + -0x18);
    piVar1 = (int *)(&this_00->field_0x10 + lVar2);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)(&this_00->field_0x0 + lVar2) + 8))();
    }
  }
  return (int)this_00;
}

Assistant:

ISceneNode *CMeshSceneNode::clone(ISceneNode *newParent, ISceneManager *newManager)
{
	if (!newParent)
		newParent = Parent;
	if (!newManager)
		newManager = SceneManager;

	CMeshSceneNode *nb = new CMeshSceneNode(Mesh, newParent,
			newManager, ID, RelativeTranslation, RelativeRotation, RelativeScale);

	nb->cloneMembers(this, newManager);
	nb->ReadOnlyMaterials = ReadOnlyMaterials;
	nb->Materials = Materials;

	if (newParent)
		nb->drop();
	return nb;
}